

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::StringMaker<std::vector<int,_std::allocator<int>_>_>::convert
                   (vector<int,_std::allocator<int>_> *in)

{
  bool bVar1;
  ostream *in_RDI;
  const_iterator it;
  ostringstream oss;
  ostream *s;
  ostringstream *this;
  String *in_stack_fffffffffffffe10;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1c8 [4];
  int *local_1a8;
  int *local_1a0;
  ostringstream local_188 [392];
  
  this = local_188;
  s = in_RDI;
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,"[");
  local_1a0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                               ((vector<int,_std::allocator<int>_> *)in_RDI);
  while( true ) {
    local_1a8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)s,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_RDI);
    if (!bVar1) break;
    local_1c8[0] = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator++((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)this,(int)((ulong)s >> 0x20));
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (local_1c8);
    detail::StringMakerBase<true>::convert<int>((int *)this);
    doctest::operator<<(s,(String *)in_RDI);
    String::~String(in_stack_fffffffffffffe10);
    std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)s,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_RDI);
    if (bVar1) {
      std::operator<<((ostream *)local_188,", ");
    }
  }
  std::operator<<((ostream *)local_188,"]");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::c_str();
  String::String(in_stack_fffffffffffffe10,(char *)this);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return (String *)s;
}

Assistant:

static String convert(const std::vector<T>& in)
  {
    std::ostringstream oss;

    oss << "[";
    for (auto it = in.begin(); it != in.end();)
    {
      oss << StringMaker<T>::convert(*it++);
      if (it != in.end()) { oss << ", "; }
    }
    oss << "]";

    return oss.str().c_str();
  }